

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_sizeof_matchState
                 (ZSTD_compressionParameters *cParams,ZSTD_paramSwitch_e useRowMatchFinder,
                 U32 enableDedicatedDictSearch,U32 forCCtx)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  iVar2 = ZSTD_allocateChainTable
                    (cParams->strategy,useRowMatchFinder,
                     (uint)(forCCtx == 0 && enableDedicatedDictSearch != 0));
  if (iVar2 == 0) {
    lVar5 = 0x80;
  }
  else {
    lVar5 = (4L << ((byte)cParams->chainLog & 0x3f)) + 0x80;
  }
  uVar8 = 0;
  if ((forCCtx != 0) && (cParams->minMatch == 3)) {
    uVar8 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar8 = cParams->windowLog;
    }
  }
  uVar1 = cParams->hashLog;
  iVar2 = ZSTD_rowMatchFinderUsed(cParams->strategy,useRowMatchFinder);
  if (forCCtx == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0x246c0;
    if (cParams->strategy < ZSTD_btopt) {
      lVar4 = 0;
    }
  }
  if (useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x660,
                  "size_t ZSTD_sizeof_matchState(const ZSTD_compressionParameters *const, const ZSTD_paramSwitch_e, const U32, const U32)"
                 );
  }
  bVar3 = (byte)uVar1;
  uVar7 = (1L << (bVar3 & 0x3f)) + 0x3fU & 0xffffffffffffffc0;
  if (iVar2 == 0) {
    uVar7 = 0;
  }
  uVar6 = 4L << ((byte)uVar8 & 0x3f);
  if (uVar8 == 0) {
    uVar6 = 0;
  }
  return lVar5 + uVar6 + (4L << (bVar3 & 0x3f)) + lVar4 + uVar7;
}

Assistant:

static size_t
ZSTD_sizeof_matchState(const ZSTD_compressionParameters* const cParams,
                       const ZSTD_paramSwitch_e useRowMatchFinder,
                       const U32 enableDedicatedDictSearch,
                       const U32 forCCtx)
{
    /* chain table size should be 0 for fast or row-hash strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder, enableDedicatedDictSearch && !forCCtx)
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;
    /* We don't use ZSTD_cwksp_alloc_size() here because the tables aren't
     * surrounded by redzones in ASAN. */
    size_t const tableSpace = chainSize * sizeof(U32)
                            + hSize * sizeof(U32)
                            + h3Size * sizeof(U32);
    size_t const optPotentialSpace =
        ZSTD_cwksp_aligned_alloc_size((MaxML+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxLL+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxOff+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((1<<Litbits) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    size_t const lazyAdditionalSpace = ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)
                                            ? ZSTD_cwksp_aligned_alloc_size(hSize)
                                            : 0;
    size_t const optSpace = (forCCtx && (cParams->strategy >= ZSTD_btopt))
                                ? optPotentialSpace
                                : 0;
    size_t const slackSpace = ZSTD_cwksp_slack_space_required();

    /* tables are guaranteed to be sized in multiples of 64 bytes (or 16 uint32_t) */
    ZSTD_STATIC_ASSERT(ZSTD_HASHLOG_MIN >= 4 && ZSTD_WINDOWLOG_MIN >= 4 && ZSTD_CHAINLOG_MIN >= 4);
    assert(useRowMatchFinder != ZSTD_ps_auto);

    DEBUGLOG(4, "chainSize: %u - hSize: %u - h3Size: %u",
                (U32)chainSize, (U32)hSize, (U32)h3Size);
    return tableSpace + optSpace + slackSpace + lazyAdditionalSpace;
}